

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

void __thiscall DomLayout::~DomLayout(DomLayout *this)

{
  QList<DomProperty_*> *this_00;
  QList<DomProperty_*> *this_01;
  QList<DomLayoutItem_*> *this_02;
  
  this_00 = &this->m_property;
  qDeleteAll<QList<DomProperty*>>(this_00);
  QList<DomProperty_*>::clear(this_00);
  this_01 = &this->m_attribute;
  qDeleteAll<QList<DomProperty*>>(this_01);
  QList<DomProperty_*>::clear(this_01);
  this_02 = &this->m_item;
  qDeleteAll<QList<DomLayoutItem*>>(this_02);
  QList<DomLayoutItem_*>::clear(this_02);
  QArrayDataPointer<DomLayoutItem_*>::~QArrayDataPointer(&this_02->d);
  QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(&this_01->d);
  QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(&this_00->d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_columnMinimumWidth).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_rowMinimumHeight).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_columnStretch).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_rowStretch).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_stretch).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_name).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

DomLayout::~DomLayout()
{
    qDeleteAll(m_property);
    m_property.clear();
    qDeleteAll(m_attribute);
    m_attribute.clear();
    qDeleteAll(m_item);
    m_item.clear();
}